

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O1

uint8 * rw::ps2::rasterLock(Raster *raster,int32 level,int32 lockMode)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint8 *puVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  
  if (0 < level) {
    bVar10 = (raster->format & 0x4000) == 0;
    bVar1 = *(byte *)((long)&raster->pixels + (long)nativeRasterOffset + 4);
    bVar4 = (byte)((bVar1 & 2) >> 1) & bVar10;
    bVar11 = (bVar1 & 4) == 0;
    iVar2 = 0x20;
    if (bVar11 || bVar10) {
      iVar2 = (uint)bVar4 * 8 + 8;
    }
    iVar3 = 4;
    if (bVar11 || bVar10) {
      iVar3 = (uint)bVar4 * 3 + 1;
    }
    iVar5 = raster->width;
    iVar6 = raster->height;
    puVar7 = raster->pixels;
    do {
      iVar8 = iVar2;
      if (iVar2 < iVar5) {
        iVar8 = iVar5;
      }
      iVar9 = iVar3;
      if (iVar3 < iVar6) {
        iVar9 = iVar6;
      }
      iVar9 = iVar9 * iVar8 * raster->depth;
      iVar8 = iVar9 + 7;
      if (-1 < iVar9) {
        iVar8 = iVar9;
      }
      iVar5 = iVar5 / 2;
      iVar6 = iVar6 / 2;
      puVar7 = puVar7 + (long)(int)((iVar8 >> 3) + 0xfU & 0xfffffff0) + 0x50;
      level = level + -1;
    } while (level != 0);
    raster->width = iVar5;
    raster->height = iVar6;
    raster->pixels = puVar7;
  }
  if ((lockMode & 4U) == 0) {
    unswizzleRaster(raster);
  }
  if ((lockMode & 2U) != 0) {
    *(byte *)&raster->privateFlags = (byte)raster->privateFlags | 2;
  }
  if ((lockMode & 1U) != 0) {
    *(byte *)&raster->privateFlags = (byte)raster->privateFlags | 4;
  }
  return raster->pixels;
}

Assistant:

uint8*
rasterLock(Raster *raster, int32 level, int32 lockMode)
{
	Ps2Raster *natras = GETPS2RASTEREXT(raster);
	assert(raster->depth != 24);

	if(level > 0){
		int32 minw, minh;
		int32 mipw, miph;
		transferMinSize(raster->format & Raster::PAL4 ? PSMT4 : PSMT8, natras->flags, &minw, &minh);
		while(level--){
			mipw = max(raster->width, minw);
			miph = max(raster->height, minh);
			raster->pixels += ALIGN16(mipw*miph*raster->depth/8) + 0x50;
			raster->width /= 2;
			raster->height /= 2;
		}
	}

	if((lockMode & Raster::LOCKNOFETCH) == 0)
		unswizzleRaster(raster);
	if(lockMode & Raster::LOCKREAD) raster->privateFlags |= Raster::PRIVATELOCK_READ;
	if(lockMode & Raster::LOCKWRITE) raster->privateFlags |= Raster::PRIVATELOCK_WRITE;
	return raster->pixels;
}